

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evol.c
# Opt level: O0

void * FFScreate_compat_info(FMFormat_conflict prior_format,char *xform_code,size_t *len_p)

{
  size_t sVar1;
  long lVar2;
  void *__dest;
  long *in_RDX;
  char *in_RSI;
  long in_RDI;
  size_t block_len;
  char *block;
  size_t in_stack_ffffffffffffffe0;
  
  sVar1 = strlen(in_RSI);
  lVar2 = sVar1 + (long)*(int *)(in_RDI + 0x20) + 1;
  __dest = ffs_malloc(in_stack_ffffffffffffffe0);
  memcpy(__dest,*(void **)(in_RDI + 0x28),(long)*(int *)(in_RDI + 0x20));
  memcpy((void *)((long)__dest + (long)*(int *)(in_RDI + 0x20)),in_RSI,
         lVar2 - *(int *)(in_RDI + 0x20));
  *in_RDX = lVar2;
  return __dest;
}

Assistant:

extern void *
FFScreate_compat_info(FMFormat prior_format, char *xform_code, size_t *len_p)
{
    char *block;
    size_t block_len = strlen(xform_code) + prior_format->server_ID.length +1;
    block = malloc(block_len);

    memcpy(block, prior_format->server_ID.value,
	   prior_format->server_ID.length);
    memcpy(block + prior_format->server_ID.length,
	   xform_code, block_len - prior_format->server_ID.length);
    *len_p = block_len;
    return block;
}